

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QSharedPointer<QRelation>_>::clear(QList<QSharedPointer<QRelation>_> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QSharedPointer<QRelation>_> *this_00;
  __off_t __length;
  QArrayDataPointer<QSharedPointer<QRelation>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QSharedPointer<QRelation>_> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<QSharedPointer<QRelation>_> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QSharedPointer<QRelation>_> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QSharedPointer<QRelation>_>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QSharedPointer<QRelation>_>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<QSharedPointer<QRelation>_> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<QSharedPointer<QRelation>_>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QSharedPointer<QRelation>_>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<QSharedPointer<QRelation>_>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QSharedPointer<QRelation>_>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QSharedPointer<QRelation>_> *)
                QArrayDataPointer<QSharedPointer<QRelation>_>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QSharedPointer<QRelation>_>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }